

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

IVec4 __thiscall tcu::getTextureFormatBitDepth(tcu *this,TextureFormat *format)

{
  int i;
  TextureSwizzle *pTVar1;
  long lVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  Vector<int,_4> *res;
  long lVar6;
  undefined4 *puVar7;
  long lVar8;
  Channel CVar9;
  Channel CVar11;
  Channel CVar12;
  Channel CVar13;
  undefined1 auVar10 [16];
  undefined1 auVar14 [16];
  IVec4 IVar15;
  IVec4 chnBits;
  uint local_5c [5];
  undefined4 local_48 [4];
  undefined1 local_38 [16];
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  
  getChannelBitDepth(format->type);
  pTVar1 = getChannelReadSwizzle(format->order);
  CVar9 = pTVar1->components[0] ^ 0x80000000;
  CVar11 = pTVar1->components[1] ^ 0x80000000;
  CVar12 = pTVar1->components[2] ^ 0x80000000;
  CVar13 = pTVar1->components[3] ^ 0x80000000;
  auVar10._0_4_ = -(uint)(-0x7ffffffd < (int)CVar9);
  auVar10._4_4_ = -(uint)(-0x7ffffffd < (int)CVar11);
  auVar10._8_4_ = -(uint)(-0x7ffffffd < (int)CVar12);
  auVar10._12_4_ = -(uint)(-0x7ffffffd < (int)CVar13);
  auVar10 = packssdw(auVar10,auVar10);
  auVar14._8_4_ = 0xffffffff;
  auVar14._0_8_ = 0xffffffffffffffff;
  auVar14._12_4_ = 0xffffffff;
  auVar10 = packsswb(auVar14 ^ auVar10,auVar14 ^ auVar10);
  local_5c[0] = auVar10._0_4_ & (uint)DAT_00ae46a0;
  lVar2 = 0;
  lVar3 = (long)(int)pTVar1->components[0];
  if (-0x7ffffffd < (int)CVar9) {
    lVar3 = lVar2;
  }
  lVar5 = (long)(int)pTVar1->components[1];
  if (-0x7ffffffd < (int)CVar11) {
    lVar5 = lVar2;
  }
  lVar6 = (long)(int)pTVar1->components[2];
  if (-0x7ffffffd < (int)CVar12) {
    lVar6 = lVar2;
  }
  lVar8 = (long)(int)pTVar1->components[3];
  if (-0x7ffffffd < (int)CVar13) {
    lVar8 = lVar2;
  }
  puVar4 = &local_20;
  local_20 = local_48[lVar3];
  local_1c = local_48[lVar5];
  local_18 = local_48[lVar6];
  local_14 = local_48[lVar8];
  IVar15.m_data._8_8_ = (undefined4 *)local_38;
  local_38 = (undefined1  [16])0x0;
  *(undefined1 (*) [16])this = (undefined1  [16])0x0;
  do {
    puVar7 = IVar15.m_data._8_8_;
    if (*(char *)((long)local_5c + lVar2) != '\0') {
      puVar7 = puVar4;
    }
    *(undefined4 *)(this + lVar2 * 4) = *puVar7;
    lVar2 = lVar2 + 1;
    IVar15.m_data._8_8_ = IVar15.m_data._8_8_ + 1;
    puVar4 = puVar4 + 1;
  } while (lVar2 != 4);
  IVar15.m_data._0_8_ = this;
  return (IVec4)IVar15.m_data;
}

Assistant:

IVec4 getTextureFormatBitDepth (const TextureFormat& format)
{
	const IVec4						chnBits		= getChannelBitDepth(format.type);
	const TextureSwizzle::Channel*	map			= getChannelReadSwizzle(format.order).components;
	const BVec4						chnMask		= BVec4(deInRange32(map[0], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[1], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[2], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE,
														deInRange32(map[3], TextureSwizzle::CHANNEL_0, TextureSwizzle::CHANNEL_3) == DE_TRUE);
	const IVec4						chnSwz		= IVec4((chnMask[0]) ? ((int)map[0]) : (0),
														(chnMask[1]) ? ((int)map[1]) : (0),
														(chnMask[2]) ? ((int)map[2]) : (0),
														(chnMask[3]) ? ((int)map[3]) : (0));

	return select(chnBits.swizzle(chnSwz.x(), chnSwz.y(), chnSwz.z(), chnSwz.w()), IVec4(0), chnMask);
}